

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets,uchar *head,size_t size
              ,string *err)

{
  int num_channels;
  uint uVar1;
  int iVar2;
  int height;
  EXRChannelInfo *pEVar3;
  pointer puVar4;
  long lVar5;
  EXRAttribute *attributes;
  int *piVar6;
  EXRHeader *pEVar7;
  bool bVar8;
  uint width;
  undefined4 uVar9;
  int iVar10;
  ostream *poVar11;
  long *plVar12;
  EXRTile *pEVar13;
  uchar **ppuVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar20;
  unsigned_long uVar21;
  ulong uVar22;
  size_t y_idx;
  ulong uVar23;
  int iVar24;
  int *piVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  EXRChannelInfo *in_stack_fffffffffffffd68;
  pointer puVar30;
  undefined4 uVar31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list_00;
  long *local_278;
  long local_268 [2];
  EXRImage *local_258;
  ulong local_250;
  ulong local_248;
  EXRHeader *local_240;
  ulong local_238;
  ulong local_230;
  uchar *local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  ulong local_208;
  size_t local_200;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar17 = exr_header->compression_type;
  pvVar20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&DAT_00000010;
  if ((iVar17 != 3) && (iVar17 != 0x80)) {
    if (iVar17 == 4) {
      pvVar20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x20;
    }
    else {
      pvVar20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    }
  }
  iVar17 = exr_header->data_window[2] - exr_header->data_window[0];
  iVar24 = exr_header->data_window[3] - exr_header->data_window[1];
  uVar15 = iVar17 + 1;
  local_248 = (ulong)uVar15;
  uVar1 = iVar24 + 1;
  local_250 = (ulong)uVar1;
  local_200 = size;
  if (iVar24 < -1 || iVar17 < -1) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Invalid data width or data height: ",0x23);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,uVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
    plVar12 = (long *)std::ostream::operator<<(poVar11,uVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_278);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
LAB_001410cb:
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
    return -4;
  }
  if (0x7fffff < iVar17 || 0x7fffff < iVar24) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"data_with or data_height too large. data_width: ",0x30);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,uVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"data_height = ",0xe);
    plVar12 = (long *)std::ostream::operator<<(poVar11,uVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_278);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
    goto LAB_001410cb;
  }
  num_channels = exr_header->num_channels;
  uVar23 = (ulong)num_channels;
  local_230 = (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar3 = exr_header->channels;
  local_258 = exr_image;
  local_240 = exr_header;
  local_228 = head;
  local_220 = offsets;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&channel_offset_list,uVar23);
  pEVar7 = local_240;
  uVar16 = 0;
  bVar28 = num_channels == 0;
  if (!bVar28) {
    piVar25 = &pEVar3->pixel_type;
    uVar21 = 0;
    bVar28 = false;
    uVar18 = 1;
    do {
      uVar15 = (uint)uVar16;
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18 - 1] = uVar21;
      uVar22 = (ulong)(uint)*piVar25;
      if (2 < uVar22) break;
      uVar15 = uVar15 + *(int *)(&DAT_0018f410 + uVar22 * 4);
      uVar16 = (ulong)uVar15;
      uVar21 = uVar21 + *(long *)(&DAT_0018f420 + uVar22 * 8);
      bVar28 = uVar23 <= uVar18;
      piVar25 = piVar25 + 0x44;
      bVar29 = uVar18 != uVar23;
      uVar18 = uVar18 + 1;
    } while (bVar29);
    uVar16 = (ulong)(int)uVar15;
  }
  if (!bVar28) {
    iVar17 = -4;
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
    goto LAB_00141925;
  }
  if (local_240->tiled == 0) {
    local_238 = (local_248 & 0xffffffff) * uVar23 * (local_250 & 0xffffffff) - 1;
    if (local_238 < 0x3fffffffff) {
      uVar23 = local_230 >> 3;
      ppuVar14 = AllocateImage(num_channels,local_240->channels,local_240->requested_pixel_types,
                               (int)local_248,(int)local_250);
      local_258->images = ppuVar14;
      uVar15 = (uint)uVar23;
      if ((int)uVar15 < 1) goto LAB_00141775;
      uVar23 = 0;
      channel_offset_list_00 = pvVar20;
      bVar29 = false;
      do {
        uVar21 = (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar23];
        bVar28 = true;
        if (uVar21 + 8 <= local_200) {
          iVar17 = *(int *)(local_228 + uVar21 + 4);
          if ((ulong)(long)iVar17 <= local_200 - (uVar21 + 8)) {
            iVar24 = *(int *)(local_228 + uVar21);
            if (iVar17 != 0 && 0xffbffffe < iVar24 - 0x200001U) {
              iVar19 = iVar24 + (int)pvVar20;
              iVar10 = pEVar7->data_window[3] + 1;
              if (iVar19 <= iVar10) {
                iVar10 = iVar19;
              }
              if (iVar10 - iVar24 != 0 && iVar24 <= iVar10) {
                iVar19 = -1;
                if (0xffffffff00000000 < ((long)iVar24 - (long)pEVar7->data_window[1]) - 0x80000000U
                   ) {
                  iVar19 = iVar24 - pEVar7->data_window[1];
                }
                if (-1 < iVar19) {
                  pvVar20 = channel_offset_list_00;
                  bVar8 = DecodePixelData(local_258->images,pEVar7->requested_pixel_types,
                                          local_228 + uVar21 + 8,(long)iVar17,
                                          pEVar7->compression_type,pEVar7->line_order,(int)local_248
                                          ,(int)local_250,(int)local_248,(int)uVar23,iVar19,
                                          iVar10 - iVar24,uVar16,(long)pEVar7->num_channels,
                                          (EXRAttribute *)pEVar7->channels,
                                          (size_t)&channel_offset_list,in_stack_fffffffffffffd68,
                                          channel_offset_list_00);
                  channel_offset_list_00 = pvVar20;
                  bVar28 = bVar29;
                  if (!bVar8) {
                    bVar28 = true;
                  }
                }
              }
            }
          }
        }
        uVar23 = uVar23 + 1;
        bVar29 = bVar28;
      } while ((uVar15 & 0x7fffffff) != uVar23);
    }
    else {
      if (err != (string *)0x0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Image data size is zero or too large: width = ",0x2e);
        uVar16 = local_250;
        poVar11 = (ostream *)std::ostream::operator<<(local_1a8,(int)local_248);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,", height = ",0xb);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,", channels = ",0xd);
        plVar12 = (long *)std::ostream::operator<<(poVar11,num_channels);
        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
        std::ostream::put((char)plVar12);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)err,(ulong)local_278);
        if (local_278 != local_268) {
          operator_delete(local_278,local_268[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
LAB_00141775:
      bVar28 = false;
    }
    iVar17 = -4;
    if (0x3ffffffffe < local_238) goto LAB_00141925;
LAB_00141887:
    if (!bVar28) {
      if (0 < local_240->num_channels) {
        piVar25 = local_240->pixel_types;
        piVar6 = local_240->requested_pixel_types;
        lVar26 = 0;
        do {
          piVar25[lVar26] = piVar6[lVar26];
          lVar26 = lVar26 + 1;
        } while (lVar26 < local_240->num_channels);
      }
      local_258->num_channels = num_channels;
      local_258->width = (int)local_248;
      local_258->height = (int)local_250;
      iVar17 = 0;
      goto LAB_00141925;
    }
    iVar17 = -4;
    if (err == (string *)0x0) goto LAB_00141925;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::string::append((char *)err);
  }
  else if (local_240->tile_size_x < 0) {
    iVar17 = -9;
    if (err == (string *)0x0) goto LAB_00141925;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size x : ",0x16);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,pEVar7->tile_size_x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_278);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
  }
  else {
    if (-1 < local_240->tile_size_y) {
      puVar30 = (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      puVar4 = (local_220->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar23 = (long)puVar30 - (long)puVar4 >> 3;
      pEVar13 = (EXRTile *)calloc(uVar23,0x20);
      local_258->tiles = pEVar13;
      if (puVar30 == puVar4) {
        pvVar20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      }
      else {
        lVar27 = (uVar23 - 1) + (ulong)(uVar23 == 0);
        lVar26 = 0;
        pvVar20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((ulong)puVar30 & 0xffffffff00000000);
        local_230 = uVar23;
        while( true ) {
          uVar23 = local_230;
          ppuVar14 = AllocateImage(num_channels,local_240->channels,local_240->requested_pixel_types
                                   ,local_240->tile_size_x,local_240->tile_size_y);
          pEVar13 = local_258->tiles;
          *(uchar ***)((long)&pEVar13->images + lVar26 * 4) = ppuVar14;
          lVar5 = *(long *)((long)(local_220->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26);
          uVar9 = (undefined4)((ulong)pvVar20 >> 0x20);
          if (local_200 < lVar5 + 0x14U) break;
          iVar10 = *(int *)(local_228 + lVar5 + 8);
          iVar19 = *(int *)(local_228 + lVar5 + 0xc);
          bVar28 = true;
          if (iVar10 == 0 && iVar19 == 0) {
            uVar23 = (ulong)*(int *)(local_228 + lVar5 + 0x10);
            if (((long)uVar23 < 4) || (local_200 - (lVar5 + 0x14U) < uVar23)) {
              pvVar20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT44(uVar9,0xfffffffc);
              if (err != (string *)0x0) {
                std::__cxx11::string::append((char *)err);
              }
            }
            else {
              uVar15 = *(uint *)(local_228 + lVar5);
              local_208 = (ulong)uVar15;
              uVar1 = local_240->tile_size_x;
              local_238 = (ulong)uVar1;
              if (iVar17 < (int)(uVar1 * uVar15)) {
                __assert_fail("tile_offset_x * tile_size_x < data_width",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                              ,0x2852,
                              "bool tinyexr::DecodeTiledPixelData(unsigned char **, int *, int *, const int *, const unsigned char *, size_t, int, int, int, int, int, int, int, int, size_t, size_t, const EXRAttribute *, size_t, const EXRChannelInfo *, const std::vector<size_t> &)"
                             );
              }
              iVar2 = *(int *)(local_228 + lVar5 + 4);
              height = local_240->tile_size_y;
              local_218 = iVar19;
              local_214 = iVar10;
              if (iVar24 < height * iVar2) {
                __assert_fail("tile_offset_y * tile_size_y < data_height",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                              ,0x2853,
                              "bool tinyexr::DecodeTiledPixelData(unsigned char **, int *, int *, const int *, const unsigned char *, size_t, int, int, int, int, int, int, int, int, size_t, size_t, const EXRAttribute *, size_t, const EXRChannelInfo *, const std::vector<size_t> &)"
                             );
              }
              ppuVar14 = *(uchar ***)((long)&pEVar13->images + lVar26 * 4);
              piVar25 = local_240->requested_pixel_types;
              local_20c = local_240->compression_type;
              local_210 = local_240->line_order;
              iVar10 = local_240->num_channels;
              width = (int)local_248 - uVar1 * uVar15;
              if ((int)((uVar15 + 1) * uVar1) <= iVar17) {
                width = uVar1;
              }
              attributes = (EXRAttribute *)local_240->channels;
              (&pEVar13->width)[lVar26] = width;
              iVar19 = (int)local_250 - height * iVar2;
              if ((iVar2 + 1) * height <= iVar24) {
                iVar19 = height;
              }
              (&pEVar13->height)[lVar26] = iVar19;
              bVar28 = DecodePixelData(ppuVar14,piVar25,local_228 + lVar5 + 0x14,uVar23,local_20c,
                                       local_210,width,height,uVar1,0,0,iVar19,uVar16,(long)iVar10,
                                       attributes,(size_t)&channel_offset_list,
                                       in_stack_fffffffffffffd68,pvVar20);
              uVar9 = SUB84(pvVar20,0);
              if (!bVar28) {
                uVar9 = 0xfffffffc;
              }
              uVar31 = (undefined4)((ulong)pvVar20 >> 0x20);
              pvVar20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT44(uVar31,uVar9);
              if (err != (string *)0x0 && !bVar28) {
                pvVar20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT44(uVar31,0xfffffffc);
                std::__cxx11::string::append((char *)err);
              }
              pEVar13 = local_258->tiles;
              (&pEVar13->offset_x)[lVar26] = (int)local_208;
              (&pEVar13->offset_y)[lVar26] = iVar2;
              (&pEVar13->level_x)[lVar26] = local_214;
              (&pEVar13->level_y)[lVar26] = local_218;
              bVar28 = false;
            }
          }
          else {
            pvVar20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT44(uVar9,0xfffffff6);
          }
          bVar29 = lVar27 == 0;
          lVar27 = lVar27 + -1;
          uVar23 = local_230;
          if ((bVar28) || (lVar26 = lVar26 + 8, bVar29)) goto LAB_00141865;
        }
        pvVar20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  CONCAT44(uVar9,0xfffffffc);
        if (err != (string *)0x0) {
          std::__cxx11::string::append((char *)err);
        }
      }
LAB_00141865:
      iVar17 = (int)pvVar20;
      if (iVar17 != 0) goto LAB_00141925;
      local_258->num_tiles = (int)uVar23;
      bVar28 = false;
      goto LAB_00141887;
    }
    iVar17 = -9;
    if (err == (string *)0x0) goto LAB_00141925;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size y : ",0x16);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,pEVar7->tile_size_y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)err,(ulong)local_278);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
LAB_00141925:
  if (channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return iVar17;
  }
  operator_delete(channel_offset_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)channel_offset_list.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)channel_offset_list.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return iVar17;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<tinyexr::tinyexr_uint64> &offsets,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;
  }

  int data_width = exr_header->data_window[2] - exr_header->data_window[0] + 1;
  int data_height = exr_header->data_window[3] - exr_header->data_window[1] + 1;

  if ((data_width < 0) || (data_height < 0)) {
    if (err) {
      std::stringstream ss;
      ss << "Invalid data width or data height: " << data_width << ", "
         << data_height << std::endl;
      (*err) += ss.str();
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Do not allow too large data_width and data_height. header invalid?
  {
    const int threshold = 1024 * 8192;  // heuristics
    if ((data_width > threshold) || (data_height > threshold)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
  }

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  bool invalid_data = false;  // TODO(LTE): Use atomic lock for MT safety.

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        calloc(static_cast<size_t>(num_tiles), sizeof(EXRTile)));

    int err_code = TINYEXR_SUCCESS;

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)

    std::vector<std::thread> workers;
    std::atomic<size_t> tile_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_tiles)) {
      num_threads = int(num_tiles);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        size_t tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
          // Allocate memory for each tile.
          exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
              num_channels, exr_header->channels,
              exr_header->requested_pixel_types, exr_header->tile_size_x,
              exr_header->tile_size_y);

          // 16 byte: tile coordinates
          // 4 byte : data size
          // ~      : data(uncompressed or compressed)
          if (offsets[tile_idx] + sizeof(int) * 5 > size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data size.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          size_t data_size =
              size_t(size - (offsets[tile_idx] + sizeof(int) * 5));
          const unsigned char *data_ptr =
              reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

          int tile_coordinates[4];
          memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[0]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[1]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[2]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[3]));

          // @todo{ LoD }
          if (tile_coordinates[2] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }
          if (tile_coordinates[3] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }

          int data_len;
          memcpy(&data_len, data_ptr + 16,
                 sizeof(int));  // 16 = sizeof(tile_coordinates)
          tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

          if (data_len < 4 || size_t(data_len) > data_size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data length.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          // Move to data addr: 20 = 16 + 4;
          data_ptr += 20;

          bool ret = tinyexr::DecodeTiledPixelData(
              exr_image->tiles[tile_idx].images,
              &(exr_image->tiles[tile_idx].width),
              &(exr_image->tiles[tile_idx].height),
              exr_header->requested_pixel_types, data_ptr,
              static_cast<size_t>(data_len), exr_header->compression_type,
              exr_header->line_order, data_width, data_height,
              tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
              exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
              static_cast<size_t>(exr_header->num_custom_attributes),
              exr_header->custom_attributes,
              static_cast<size_t>(exr_header->num_channels),
              exr_header->channels, channel_offset_list);

          if (!ret) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Failed to decode tile data.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
          }

          exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
          exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
          exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
          exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }  // num_thread loop

    for (auto &t : workers) {
      t.join();
    }

#else
    }
#endif

    if (err_code != TINYEXR_SUCCESS) {
      return err_code;
    }

    exr_image->num_tiles = static_cast<int>(num_tiles);
  } else {  // scanline format

    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(reinterpret_cast<unsigned int *>(&line_no));
            tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window[3] + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window[1]);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window[1];
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      std::stringstream ss;
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}